

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O0

void __thiscall
QSortFilterProxyModelPrivate::source_items_inserted
          (QSortFilterProxyModelPrivate *this,QModelIndex *source_parent,int start,int end,
          Direction direction)

{
  Mapping *this_00;
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  QSortFilterProxyModel *pQVar6;
  Mapping **ppMVar7;
  QList<int> *this_01;
  qsizetype qVar8;
  long lVar9;
  iterator source_to_proxy_00;
  const_reference piVar10;
  arrow_operator_result ppQVar11;
  int in_ECX;
  uint in_EDX;
  QModelIndex *in_RSI;
  QSortFilterProxyModelPrivate *in_RDI;
  Direction in_R8D;
  long in_FS_OFFSET;
  int in_stack_00000060;
  int ortho_item;
  int ortho_end;
  QList<int> *orthogonal_source_to_proxy;
  QList<int> *orthogonal_proxy_to_source;
  int i;
  int source_item;
  int proxy_item;
  int proxy_count;
  int old_item_count;
  int delta_item_count;
  QList<int> *proxy_to_source;
  QList<int> *source_to_proxy;
  Mapping *m;
  Mapping *m_1;
  QSortFilterProxyModel *q;
  QList<int> source_items;
  QModelIndex proxy_parent;
  const_iterator it;
  undefined4 in_stack_fffffffffffffe38;
  parameter_type in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 uVar12;
  int in_stack_fffffffffffffe44;
  QModelIndex *in_stack_fffffffffffffe48;
  undefined2 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe52;
  undefined1 in_stack_fffffffffffffe53;
  int in_stack_fffffffffffffe54;
  QSortFilterProxyModelPrivate *in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  QSortFilterProxyModelPrivate *in_stack_fffffffffffffe68;
  QSortFilterProxyModelPrivate *in_stack_fffffffffffffe70;
  QList<int> *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  QSortFilterProxyModelPrivate *in_stack_fffffffffffffe88;
  Mapping *local_160;
  uint local_130;
  undefined4 in_stack_fffffffffffffee8;
  Direction in_stack_fffffffffffffeec;
  QModelIndex *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int iVar13;
  int in_stack_ffffffffffffff40;
  QMessageLogger local_88;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  piter local_50;
  piter local_40;
  QModelIndexWrapper local_30;
  piter local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = q_func(in_RDI);
  if ((-1 < (int)in_EDX) && (-1 < in_ECX)) {
    local_18.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_18.d = (Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
                  *)&DAT_aaaaaaaaaaaaaaaa;
    QtPrivate::QModelIndexWrapper::QModelIndexWrapper(&local_30,in_RSI);
    local_18 = (piter)QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>
                      ::constFind((QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>
                                   *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  (QModelIndexWrapper *)
                                  CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    local_40 = (piter)QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>
                      ::constEnd((QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>
                                  *)in_stack_fffffffffffffe48);
    bVar2 = QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::
            const_iterator::operator==
                      ((const_iterator *)in_stack_fffffffffffffe48,
                       (const_iterator *)
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    if (bVar2) {
      bVar2 = can_create_mapping(in_stack_fffffffffffffe70,(QModelIndex *)in_stack_fffffffffffffe68)
      ;
      if (bVar2) {
        local_50 = (piter)create_mapping(in_stack_fffffffffffffe88,
                                         (QModelIndex *)
                                         CONCAT44(in_stack_fffffffffffffe84,
                                                  in_stack_fffffffffffffe80));
        local_18 = local_50;
        ppMVar7 = QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::
                  const_iterator::value((const_iterator *)0x870498);
        this_00 = *ppMVar7;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        local_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        (*(pQVar6->super_QAbstractProxyModel).super_QAbstractItemModel.super_QObject._vptr_QObject
          [0x33])(&local_68,pQVar6,in_RSI);
        qVar8 = QList<int>::size(&this_00->source_rows);
        if (0 < qVar8) {
          QList<int>::size(&this_00->source_rows);
          QAbstractItemModel::beginInsertRows
                    ((QAbstractItemModel *)in_stack_fffffffffffffe70,
                     (QModelIndex *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                     in_stack_fffffffffffffe60);
          QAbstractItemModel::endInsertRows((QAbstractItemModel *)in_stack_fffffffffffffe58);
        }
        qVar8 = QList<int>::size(&this_00->source_columns);
        if (0 < qVar8) {
          QList<int>::size(&this_00->source_columns);
          QAbstractItemModel::beginInsertColumns
                    ((QAbstractItemModel *)in_stack_fffffffffffffe70,
                     (QModelIndex *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                     in_stack_fffffffffffffe60);
          QAbstractItemModel::endInsertColumns((QAbstractItemModel *)in_stack_fffffffffffffe58);
        }
      }
    }
    else {
      ppMVar7 = QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::
                const_iterator::value((const_iterator *)0x8705b9);
      local_160 = *ppMVar7;
      if (in_R8D == Rows) {
        this_01 = &local_160->proxy_rows;
      }
      else {
        this_01 = &local_160->proxy_columns;
        local_160 = (Mapping *)&local_160->source_columns;
      }
      iVar3 = (in_ECX - in_EDX) + 1;
      qVar8 = QList<int>::size(this_01);
      iVar4 = (int)qVar8;
      uVar12 = 0;
      iVar13 = iVar3;
      updateChildrenMapping
                (in_RDI,in_RSI,(Mapping *)CONCAT44(in_EDX,in_ECX),in_R8D,in_stack_ffffffffffffff40,
                 (int)((ulong)pQVar6 >> 0x20),in_stack_00000060,SUB81((ulong)pQVar6 >> 0x18,0));
      if (((int)in_EDX < 0) ||
         (lVar9 = (long)(int)in_EDX, qVar8 = QList<int>::size(this_01), qVar8 < lVar9)) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)
                   CONCAT44(in_stack_fffffffffffffe54,
                            CONCAT13(in_stack_fffffffffffffe53,
                                     CONCAT12(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)))
                   ,(char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                   (char *)CONCAT44(in_stack_fffffffffffffe3c,iVar3));
        QMessageLogger::warning
                  (&local_88,"QSortFilterProxyModel: invalid inserted rows reported by source model"
                  );
        remove_from_mapping(in_stack_fffffffffffffe68,
                            (QModelIndex *)
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      }
      else {
        source_to_proxy_00 =
             QList<int>::insert((QList<int> *)in_stack_fffffffffffffe58,
                                CONCAT44(in_stack_fffffffffffffe54,
                                         CONCAT13(in_stack_fffffffffffffe53,
                                                  CONCAT12(in_stack_fffffffffffffe52,
                                                           in_stack_fffffffffffffe50))),
                                (qsizetype)in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
        if ((int)in_EDX < iVar4) {
          qVar8 = QList<int>::size(&local_160->source_rows);
          in_stack_ffffffffffffff04 = (int)qVar8;
          for (in_stack_ffffffffffffff00 = 0; in_stack_ffffffffffffff00 < in_stack_ffffffffffffff04;
              in_stack_ffffffffffffff00 = in_stack_ffffffffffffff00 + 1) {
            piVar10 = QList<int>::at((QList<int> *)CONCAT44(in_stack_fffffffffffffe44,uVar12),
                                     CONCAT44(in_stack_fffffffffffffe3c,iVar3));
            in_stack_fffffffffffffefc = *piVar10;
            if ((int)in_EDX <= in_stack_fffffffffffffefc) {
              QList<int>::replace(in_stack_fffffffffffffe78,(qsizetype)in_stack_fffffffffffffe70,
                                  (parameter_type)((ulong)in_stack_fffffffffffffe68 >> 0x20));
            }
          }
          build_source_to_proxy_mapping
                    ((QList<int> *)
                     CONCAT44(in_stack_fffffffffffffe54,
                              CONCAT13(in_stack_fffffffffffffe53,
                                       CONCAT12(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)
                                      )),(QList<int> *)in_stack_fffffffffffffe48,
                     in_stack_fffffffffffffe44);
        }
        QList<int>::QList((QList<int> *)0x87086a);
        for (; (int)in_EDX <= in_ECX; in_EDX = in_EDX + 1) {
          if (in_R8D == Rows) {
            bVar2 = filterAcceptsRowInternal
                              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                               in_stack_fffffffffffffe48);
            if (bVar2) {
LAB_008708f5:
              QList<int>::append((QList<int> *)0x870909,in_stack_fffffffffffffe3c);
            }
          }
          else {
            uVar5 = (*(pQVar6->super_QAbstractProxyModel).super_QAbstractItemModel.super_QObject.
                      _vptr_QObject[0x37])(pQVar6,(ulong)in_EDX,in_RSI);
            if ((uVar5 & 1) != 0) goto LAB_008708f5;
          }
        }
        ppQVar11 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                   ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                                 *)CONCAT44(in_stack_fffffffffffffe44,uVar12));
        iVar3 = (*((*ppQVar11)->super_QObject)._vptr_QObject[0xf])(*ppQVar11,in_RSI);
        if ((iVar3 == iVar13) && (bVar2 = QList<int>::isEmpty((QList<int> *)0x870a3d), bVar2)) {
          if (in_R8D == Columns) {
            ppQVar11 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                       ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                                     *)CONCAT44(in_stack_fffffffffffffe44,uVar12));
            iVar3 = (*((*ppQVar11)->super_QObject)._vptr_QObject[0xf])(*ppQVar11,in_RSI);
          }
          else {
            in_stack_fffffffffffffe58 =
                 (QSortFilterProxyModelPrivate *)
                 QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                 ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                               *)CONCAT44(in_stack_fffffffffffffe44,uVar12));
            pQVar1 = (QAbstractItemModel *)
                     (in_stack_fffffffffffffe58->super_QAbstractProxyModelPrivate).
                     super_QAbstractItemModelPrivate.super_QObjectPrivate.super_QObjectData.
                     _vptr_QObjectData;
            in_stack_fffffffffffffe54 =
                 (*(pQVar1->super_QObject)._vptr_QObject[0x10])(pQVar1,in_RSI);
            iVar3 = in_stack_fffffffffffffe54;
          }
          QList<int>::resize((QList<int> *)
                             CONCAT44(in_stack_fffffffffffffe54,
                                      CONCAT13(in_stack_fffffffffffffe53,
                                               CONCAT12(in_stack_fffffffffffffe52,
                                                        in_stack_fffffffffffffe50))),
                             (qsizetype)in_stack_fffffffffffffe48);
          for (local_130 = 0; (int)local_130 < iVar3; local_130 = local_130 + 1) {
            if (in_R8D == Columns) {
              in_stack_fffffffffffffe53 =
                   filterAcceptsRowInternal
                             (in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                              in_stack_fffffffffffffe48);
              if ((bool)in_stack_fffffffffffffe53) {
LAB_00870b85:
                QList<int>::append((QList<int> *)0x870b99,in_stack_fffffffffffffe3c);
              }
            }
            else {
              uVar5 = (*(pQVar6->super_QAbstractProxyModel).super_QAbstractItemModel.super_QObject.
                        _vptr_QObject[0x37])(pQVar6,(ulong)local_130,in_RSI);
              in_stack_fffffffffffffe52 = (undefined1)uVar5;
              if ((uVar5 & 1) != 0) goto LAB_00870b85;
            }
          }
          if (in_R8D == Columns) {
            sort_source_rows((QSortFilterProxyModelPrivate *)
                             CONCAT44(in_stack_fffffffffffffefc,in_EDX),
                             (QList<int> *)in_stack_fffffffffffffef0,
                             (QModelIndex *)
                             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          }
          build_source_to_proxy_mapping
                    ((QList<int> *)
                     CONCAT44(in_stack_fffffffffffffe54,
                              CONCAT13(in_stack_fffffffffffffe53,
                                       CONCAT12(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)
                                      )),(QList<int> *)in_stack_fffffffffffffe48,
                     in_stack_fffffffffffffe44);
        }
        if (in_R8D == Rows) {
          sort_source_rows((QSortFilterProxyModelPrivate *)
                           CONCAT44(in_stack_fffffffffffffefc,in_EDX),
                           (QList<int> *)in_stack_fffffffffffffef0,
                           (QModelIndex *)
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        }
        insert_source_items((QSortFilterProxyModelPrivate *)CONCAT44(iVar13,iVar4),
                            (QList<int> *)source_to_proxy_00.i,
                            (QList<int> *)
                            CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                            (QList<int> *)CONCAT44(in_stack_fffffffffffffefc,in_EDX),
                            in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                            SUB41((uint)in_stack_fffffffffffffee8 >> 0x18,0));
        QList<int>::~QList((QList<int> *)0x870c75);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSortFilterProxyModelPrivate::source_items_inserted(
    const QModelIndex &source_parent, int start, int end, Direction direction)
{
    Q_Q(QSortFilterProxyModel);
    if ((start < 0) || (end < 0))
        return;
    IndexMap::const_iterator it = source_index_mapping.constFind(source_parent);
    if (it == source_index_mapping.constEnd()) {
        if (!can_create_mapping(source_parent))
            return;
        it = create_mapping(source_parent);
        Mapping *m = it.value();
        QModelIndex proxy_parent = q->mapFromSource(source_parent);
        if (m->source_rows.size() > 0) {
            q->beginInsertRows(proxy_parent, 0, m->source_rows.size() - 1);
            q->endInsertRows();
        }
        if (m->source_columns.size() > 0) {
            q->beginInsertColumns(proxy_parent, 0, m->source_columns.size() - 1);
            q->endInsertColumns();
        }
        return;
    }

    Mapping *m = it.value();
    QList<int> &source_to_proxy = (direction == Direction::Rows) ? m->proxy_rows : m->proxy_columns;
    QList<int> &proxy_to_source = (direction == Direction::Rows) ? m->source_rows : m->source_columns;

    int delta_item_count = end - start + 1;
    int old_item_count = source_to_proxy.size();

    updateChildrenMapping(source_parent, m, direction, start, end, delta_item_count, false);

    // Expand source-to-proxy mapping to account for new items
    if (start < 0 || start > source_to_proxy.size()) {
        qWarning("QSortFilterProxyModel: invalid inserted rows reported by source model");
        remove_from_mapping(source_parent);
        return;
    }
    source_to_proxy.insert(start, delta_item_count, -1);

    if (start < old_item_count) {
        // Adjust existing "stale" indexes in proxy-to-source mapping
        int proxy_count = proxy_to_source.size();
        for (int proxy_item = 0; proxy_item < proxy_count; ++proxy_item) {
            int source_item = proxy_to_source.at(proxy_item);
            if (source_item >= start)
                proxy_to_source.replace(proxy_item, source_item + delta_item_count);
        }
        build_source_to_proxy_mapping(proxy_to_source, source_to_proxy);
    }

    // Figure out which items to add to mapping based on filter
    QList<int> source_items;
    for (int i = start; i <= end; ++i) {
        if ((direction == Direction::Rows)
            ? filterAcceptsRowInternal(i, source_parent)
            : q->filterAcceptsColumn(i, source_parent)) {
            source_items.append(i);
        }
    }

    if (model->rowCount(source_parent) == delta_item_count) {
        // Items were inserted where there were none before.
        // If it was new rows make sure to create mappings for columns so that a
        // valid mapping can be retrieved later and vice-versa.

        QList<int> &orthogonal_proxy_to_source = (direction == Direction::Columns) ? m->source_rows : m->source_columns;
        QList<int> &orthogonal_source_to_proxy = (direction == Direction::Columns) ? m->proxy_rows : m->proxy_columns;

        if (orthogonal_source_to_proxy.isEmpty()) {
            const int ortho_end = (direction == Direction::Columns) ? model->rowCount(source_parent) : model->columnCount(source_parent);

            orthogonal_source_to_proxy.resize(ortho_end);

            for (int ortho_item = 0; ortho_item < ortho_end; ++ortho_item) {
                if ((direction == Direction::Columns) ? filterAcceptsRowInternal(ortho_item, source_parent)
                        : q->filterAcceptsColumn(ortho_item, source_parent)) {
                    orthogonal_proxy_to_source.append(ortho_item);
                }
            }
            if (direction == Direction::Columns) {
                // We're reacting to columnsInserted, but we've just inserted new rows. Sort them.
                sort_source_rows(orthogonal_proxy_to_source, source_parent);
            }
            build_source_to_proxy_mapping(orthogonal_proxy_to_source, orthogonal_source_to_proxy);
        }
    }

    // Sort and insert the items
    if (direction == Direction::Rows) // Only sort rows
        sort_source_rows(source_items, source_parent);
    insert_source_items(source_to_proxy, proxy_to_source, source_items, source_parent, direction);
}